

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O0

time_t ngx_next_time(time_t when)

{
  time_t s;
  undefined1 local_60 [8];
  tm tm;
  time_t next;
  time_t now;
  time_t when_local;
  
  s = ngx_cached_time->sec;
  ngx_libc_localtime(s,(tm *)local_60);
  tm.tm_sec = (int)(when / 0xe10);
  local_60._4_4_ = (undefined4)((when % 0xe10) / 0x3c);
  local_60._0_4_ = (undefined4)((when % 0xe10) % 0x3c);
  tm.tm_zone = (char *)mktime((tm *)local_60);
  if (tm.tm_zone == (char *)0xffffffffffffffff) {
    when_local = -1;
  }
  else {
    when_local = (time_t)tm.tm_zone;
    if ((long)tm.tm_zone - s < 1) {
      tm.tm_min = tm.tm_min + 1;
      when_local = mktime((tm *)local_60);
      if (when_local == -1) {
        when_local = -1;
      }
    }
  }
  return when_local;
}

Assistant:

time_t
ngx_next_time(time_t when)
{
    time_t     now, next;
    struct tm  tm;

    now = ngx_time();

    ngx_libc_localtime(now, &tm);

    tm.tm_hour = (int) (when / 3600);
    when %= 3600;
    tm.tm_min = (int) (when / 60);
    tm.tm_sec = (int) (when % 60);

    next = mktime(&tm);

    if (next == -1) {
        return -1;
    }

    if (next - now > 0) {
        return next;
    }

    tm.tm_mday++;

    /* mktime() should normalize a date (Jan 32, etc) */

    next = mktime(&tm);

    if (next != -1) {
        return next;
    }

    return -1;
}